

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O3

int32_t cornelich::util::thread_id_bits(void)

{
  uint uVar1;
  runtime_error *this;
  uint v;
  ifstream is;
  int local_21c;
  long local_218 [4];
  byte abStack_1f8 [488];
  
  std::ifstream::ifstream(local_218,"/proc/sys/kernel/threads-max",_S_in);
  if ((abStack_1f8[*(long *)(local_218[0] + -0x18)] & 5) == 0) {
    std::istream::_M_extract<unsigned_int>((uint *)local_218);
    uVar1 = 0x1f;
    if (local_21c - 1U != 0) {
      for (; local_21c - 1U >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    std::ifstream::~ifstream(local_218);
    return (uVar1 ^ 0xffffffe0) + 0x21;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Cannot access /proc/sys/kernel/threads-max");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::int32_t thread_id_bits()
{
    std::ifstream is("/proc/sys/kernel/threads-max");
    if(!is)
        throw std::runtime_error("Cannot access /proc/sys/kernel/threads-max");
    unsigned int v;
    is >> v;
    return log2_bits(v - 1) + 1;
}